

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSort.c
# Opt level: O3

void Msat_SolverSortDB(Msat_Solver_t *p)

{
  int size;
  Msat_ClauseVec_t *p_00;
  Msat_Clause_t **array;
  double seed;
  
  p_00 = Msat_SolverReadLearned(p);
  size = Msat_ClauseVecReadSize(p_00);
  array = Msat_ClauseVecReadArray(p_00);
  Msat_SolverSort(array,size,seed);
  return;
}

Assistant:

void Msat_SolverSortDB( Msat_Solver_t * p )
{
    Msat_ClauseVec_t * pVecClauses;
    Msat_Clause_t ** pLearned;
    int nLearned;
    // read the parameters
    pVecClauses = Msat_SolverReadLearned( p );
    nLearned    = Msat_ClauseVecReadSize( pVecClauses );
    pLearned    = Msat_ClauseVecReadArray( pVecClauses );
    // Msat_SolverSort the array
//    qMsat_SolverSort( (void *)pLearned, nLearned, sizeof(Msat_Clause_t *), 
//            (int (*)(const void *, const void *)) Msat_SolverSortCompare );
//    printf( "Msat_SolverSorting.\n" );
    Msat_SolverSort( pLearned, nLearned, 91648253 );
/*
    if ( nLearned > 2 )
    {
    printf( "Clause 1: %0.20f\n", Msat_ClauseReadActivity(pLearned[0]) );
    printf( "Clause 2: %0.20f\n", Msat_ClauseReadActivity(pLearned[1]) );
    printf( "Clause 3: %0.20f\n", Msat_ClauseReadActivity(pLearned[2]) );
    }
*/
}